

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O2

bool __thiscall
cppcms::anon_unknown_0::mounted::dispatch
          (mounted *this,string *url,char *method,application *param_3)

{
  application *paVar1;
  bool bVar2;
  string_type sStack_58;
  value_type local_38;
  
  bVar2 = option::matches(&this->super_option,url,method);
  if (bVar2) {
    paVar1 = this->app_;
    booster::match_results<const_char_*>::operator[]
              (&local_38,&(this->super_option).match_,this->select_);
    booster::sub_match<char_const*>::str_abi_cxx11_(&sStack_58,&local_38);
    (*paVar1->_vptr_application[2])(paVar1,&sStack_58);
    std::__cxx11::string::~string((string *)&sStack_58);
  }
  return bVar2;
}

Assistant:

virtual bool dispatch(std::string const &url,char const *method,application *)
			{
				if(matches(url,method)) {
					app_->main(match_[select_]);
					return true;
				}
				return false;
			}